

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

VkResult __thiscall myvk::Device::create_allocator(Device *this)

{
  VkResult VVar1;
  element_type *peVar2;
  element_type *this_00;
  VkPhysicalDevice pAllocator;
  long in_RDI;
  VmaAllocatorCreateInfo create_info;
  VmaVulkanFunctions vk_funcs;
  undefined1 local_130 [8];
  VmaAllocatorCreateInfo *pCreateInfo;
  
  memset(local_130,0,0x58);
  peVar2 = std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2b4e35);
  PhysicalDevice::GetInstancePtr(peVar2);
  this_00 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2b4e45);
  Instance::GetHandle(this_00);
  pCreateInfo = *(VmaAllocatorCreateInfo **)(in_RDI + 0x268);
  peVar2 = std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2b4e6b);
  pAllocator = PhysicalDevice::GetHandle(peVar2);
  VVar1 = vmaCreateAllocator(pCreateInfo,(VmaAllocator *)pAllocator);
  return VVar1;
}

Assistant:

VkResult Device::create_allocator() {
	VmaVulkanFunctions vk_funcs = {
		/// Required when using VMA_DYNAMIC_VULKAN_FUNCTIONS.
		vkGetInstanceProcAddr,
		/// Required when using VMA_DYNAMIC_VULKAN_FUNCTIONS.
		vkGetDeviceProcAddr,
		vkGetPhysicalDeviceProperties,
		vkGetPhysicalDeviceMemoryProperties,
		vkAllocateMemory,
		vkFreeMemory,
		vkMapMemory,
		vkUnmapMemory,
		vkFlushMappedMemoryRanges,
		vkInvalidateMappedMemoryRanges,
		vkBindBufferMemory,
		vkBindImageMemory,
		vkGetBufferMemoryRequirements,
		vkGetImageMemoryRequirements,
		vkCreateBuffer,
		vkDestroyBuffer,
		vkCreateImage,
		vkDestroyImage,
		vkCmdCopyBuffer,
#if VMA_DEDICATED_ALLOCATION || VMA_VULKAN_VERSION >= 1001000
		/// Fetch "vkGetBufferMemoryRequirements2" on Vulkan >= 1.1, fetch "vkGetBufferMemoryRequirements2KHR" when
		/// using
		/// VK_KHR_dedicated_allocation extension.
		vkGetBufferMemoryRequirements2KHR,
		/// Fetch "vkGetImageMemoryRequirements 2" on Vulkan >= 1.1, fetch "vkGetImageMemoryRequirements2KHR" when using
		/// VK_KHR_dedicated_allocation extension.
		vkGetImageMemoryRequirements2KHR,
#endif
#if VMA_BIND_MEMORY2 || VMA_VULKAN_VERSION >= 1001000
		/// Fetch "vkBindBufferMemory2" on Vulkan >= 1.1, fetch "vkBindBufferMemory2KHR" when using VK_KHR_bind_memory2
		/// extension.
		vkBindBufferMemory2KHR,
		/// Fetch "vkBindImageMemory2" on Vulkan >= 1.1, fetch "vkBindImageMemory2KHR" when using VK_KHR_bind_memory2
		/// extension.
		vkBindImageMemory2KHR,
#endif
#if VMA_MEMORY_BUDGET || VMA_VULKAN_VERSION >= 1001000
		vkGetPhysicalDeviceMemoryProperties2KHR,
#endif
	};

	VmaAllocatorCreateInfo create_info = {};
	create_info.instance = m_physical_device_ptr->GetInstancePtr()->GetHandle();
	create_info.device = m_device;
	create_info.physicalDevice = m_physical_device_ptr->GetHandle();
	create_info.pVulkanFunctions = &vk_funcs;

	return vmaCreateAllocator(&create_info, &m_allocator);
}